

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_init.cpp
# Opt level: O3

void tracing_layer::createAPITracerContextImp(void)

{
  pGlobalAPITracerContextImp = (undefined8 *)operator_new(0xb8);
  *pGlobalAPITracerContextImp = &PTR__APITracerContextImp_00182c98;
  pGlobalAPITracerContextImp[1] = 0;
  pGlobalAPITracerContextImp[2] = 0;
  pGlobalAPITracerContextImp[3] = 0;
  pGlobalAPITracerContextImp[4] = 0;
  pGlobalAPITracerContextImp[5] = 0;
  pGlobalAPITracerContextImp[6] = 0;
  pGlobalAPITracerContextImp[7] = 0;
  pGlobalAPITracerContextImp[10] = pGlobalAPITracerContextImp + 9;
  pGlobalAPITracerContextImp[9] = pGlobalAPITracerContextImp + 9;
  pGlobalAPITracerContextImp[0xb] = 0;
  pGlobalAPITracerContextImp[0xd] = pGlobalAPITracerContextImp + 0xc;
  pGlobalAPITracerContextImp[0xc] = pGlobalAPITracerContextImp + 0xc;
  pGlobalAPITracerContextImp[0xe] = 0;
  pGlobalAPITracerContextImp[0x10] = pGlobalAPITracerContextImp + 0xf;
  pGlobalAPITracerContextImp[0xf] = pGlobalAPITracerContextImp + 0xf;
  pGlobalAPITracerContextImp[0x11] = 0;
  pGlobalAPITracerContextImp[0x12] = 0;
  pGlobalAPITracerContextImp[0x13] = 0;
  pGlobalAPITracerContextImp[0x14] = 0;
  pGlobalAPITracerContextImp[0x15] = 0;
  pGlobalAPITracerContextImp[0x16] = 0;
  pGlobalAPITracerContextImp[8] = pGlobalAPITracerContextImp + 6;
  return;
}

Assistant:

void __attribute__((constructor)) createAPITracerContextImp() {
        pGlobalAPITracerContextImp = new struct APITracerContextImp;
    }